

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O2

void Gia_ManStop(Gia_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  int i;
  long lVar2;
  
  Gia_DatFree(p->pUData);
  if (p->vSeqModelVec != (Vec_Ptr_t *)0x0) {
    Vec_PtrFreeFree(p->vSeqModelVec);
  }
  Gia_ManStaticFanoutStop(p);
  Tim_ManStopP((Tim_Man_t **)&p->pManTime);
  if (p->pManTime != (void *)0x0) {
    __assert_fail("p->pManTime == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMan.c"
                  ,0x5a,"void Gia_ManStop(Gia_Man_t *)");
  }
  Vec_PtrFreeFree(p->vNamesIn);
  Vec_PtrFreeFree(p->vNamesOut);
  Vec_IntFreeP(&p->vSwitching);
  Vec_IntFreeP(&p->vSuper);
  Vec_IntFreeP(&p->vStore);
  Vec_IntFreeP(&p->vClassNew);
  Vec_IntFreeP(&p->vClassOld);
  Vec_WrdFreeP(&p->vSims);
  Vec_WrdFreeP(&p->vSimsT);
  Vec_WrdFreeP(&p->vSimsPi);
  Vec_WrdFreeP(&p->vSimsPo);
  Vec_IntFreeP(&p->vTimeStamps);
  Vec_FltFreeP(&p->vTiming);
  pVVar1 = (Vec_Ptr_t *)p->vClockDoms;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    for (lVar2 = 0; lVar2 < pVVar1->nSize; lVar2 = lVar2 + 1) {
      if ((Vec_Ptr_t *)pVVar1->pArray[lVar2] != (Vec_Ptr_t *)0x0) {
        Vec_PtrFree((Vec_Ptr_t *)pVVar1->pArray[lVar2]);
      }
    }
    Vec_PtrFree(pVVar1);
    p->vClockDoms = (Vec_Vec_t *)0x0;
  }
  Vec_IntFreeP(&p->vCofVars);
  Vec_IntFreeP(&p->vIdsOrig);
  Vec_IntFreeP(&p->vIdsEquiv);
  Vec_IntFreeP(&p->vLutConfigs);
  Vec_IntFreeP(&p->vEdgeDelay);
  Vec_IntFreeP(&p->vEdgeDelayR);
  Vec_IntFreeP(&p->vEdge1);
  Vec_IntFreeP(&p->vEdge2);
  Vec_IntFreeP(&p->vUserPiIds);
  Vec_IntFreeP(&p->vUserPoIds);
  Vec_IntFreeP(&p->vUserFfIds);
  Vec_IntFreeP(&p->vFlopClasses);
  Vec_IntFreeP(&p->vGateClasses);
  Vec_IntFreeP(&p->vObjClasses);
  Vec_IntFreeP(&p->vInitClasses);
  Vec_IntFreeP(&p->vRegClasses);
  Vec_IntFreeP(&p->vRegInits);
  Vec_IntFreeP(&p->vDoms);
  Vec_IntFreeP(&p->vBarBufs);
  Vec_IntFreeP(&p->vXors);
  Vec_IntFreeP(&p->vLevels);
  Vec_IntFreeP(&p->vTruths);
  Vec_IntErase(&p->vCopies);
  Vec_IntErase(&p->vCopies2);
  Vec_IntFreeP(&p->vVar2Obj);
  Vec_IntErase(&p->vCopiesTwo);
  Vec_IntErase(&p->vSuppVars);
  Vec_WrdFreeP(&p->vSuppWords);
  Vec_IntFreeP(&p->vTtNums);
  Vec_IntFreeP(&p->vTtNodes);
  Vec_WrdFreeP(&p->vTtMemory);
  pVVar1 = p->vTtInputs;
  if (pVVar1 != (Vec_Ptr_t *)0x0) {
    if (pVVar1->pArray != (void **)0x0) {
      free(pVVar1->pArray);
      p->vTtInputs->pArray = (void **)0x0;
      pVVar1 = p->vTtInputs;
      if (pVVar1 == (Vec_Ptr_t *)0x0) goto LAB_001f8b4b;
    }
    free(pVVar1);
    p->vTtInputs = (Vec_Ptr_t *)0x0;
  }
LAB_001f8b4b:
  Vec_IntFreeP(&p->vMapping);
  Vec_WecFreeP(&p->vMapping2);
  Vec_WecFreeP(&p->vFanouts2);
  Vec_IntFreeP(&p->vCellMapping);
  Vec_IntFreeP(&p->vPacking);
  Vec_IntFreeP(&p->vConfigs);
  if (p->pCellStr != (char *)0x0) {
    free(p->pCellStr);
    p->pCellStr = (char *)0x0;
  }
  Vec_FltFreeP(&p->vInArrs);
  Vec_FltFreeP(&p->vOutReqs);
  Vec_IntFreeP(&p->vCiArrs);
  Vec_IntFreeP(&p->vCoReqs);
  Vec_IntFreeP(&p->vCoArrs);
  Vec_IntFreeP(&p->vCoAttrs);
  Gia_ManStopP(&p->pAigExtra);
  Vec_IntFree(p->vCis);
  Vec_IntFree(p->vCos);
  Vec_IntErase(&p->vHash);
  Vec_IntErase(&p->vHTable);
  Vec_IntErase(&p->vRefs);
  if (p->pData2 != (uint *)0x0) {
    free(p->pData2);
    p->pData2 = (uint *)0x0;
  }
  if (p->pTravIds != (int *)0x0) {
    free(p->pTravIds);
    p->pTravIds = (int *)0x0;
  }
  if (p->pPlacement != (Gia_Plc_t *)0x0) {
    free(p->pPlacement);
    p->pPlacement = (Gia_Plc_t *)0x0;
  }
  if (p->pSwitching != (uchar *)0x0) {
    free(p->pSwitching);
    p->pSwitching = (uchar *)0x0;
  }
  if (p->pCexSeq != (Abc_Cex_t *)0x0) {
    free(p->pCexSeq);
    p->pCexSeq = (Abc_Cex_t *)0x0;
  }
  if (p->pCexComb != (Abc_Cex_t *)0x0) {
    free(p->pCexComb);
    p->pCexComb = (Abc_Cex_t *)0x0;
  }
  if (p->pIso != (int *)0x0) {
    free(p->pIso);
    p->pIso = (int *)0x0;
  }
  if (p->pFanData != (int *)0x0) {
    free(p->pFanData);
    p->pFanData = (int *)0x0;
  }
  if (p->pReprsOld != (int *)0x0) {
    free(p->pReprsOld);
    p->pReprsOld = (int *)0x0;
  }
  if (p->pReprs != (Gia_Rpr_t *)0x0) {
    free(p->pReprs);
    p->pReprs = (Gia_Rpr_t *)0x0;
  }
  if (p->pNexts != (int *)0x0) {
    free(p->pNexts);
    p->pNexts = (int *)0x0;
  }
  if (p->pSibls != (int *)0x0) {
    free(p->pSibls);
    p->pSibls = (int *)0x0;
  }
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  if (p->pLutRefs != (int *)0x0) {
    free(p->pLutRefs);
    p->pLutRefs = (int *)0x0;
  }
  if (p->pMuxes != (uint *)0x0) {
    free(p->pMuxes);
    p->pMuxes = (uint *)0x0;
  }
  if (p->pObjs != (Gia_Obj_t *)0x0) {
    free(p->pObjs);
    p->pObjs = (Gia_Obj_t *)0x0;
  }
  if (p->pSpec != (char *)0x0) {
    free(p->pSpec);
    p->pSpec = (char *)0x0;
  }
  free(p->pName);
  free(p);
  return;
}

Assistant:

void Gia_ManStop( Gia_Man_t * p )
{
    extern void Gia_DatFree( Gia_Dat_t * p );
    Gia_DatFree( p->pUData );
    if ( p->vSeqModelVec )
        Vec_PtrFreeFree( p->vSeqModelVec );
    Gia_ManStaticFanoutStop( p );
    Tim_ManStopP( (Tim_Man_t **)&p->pManTime );
    assert( p->pManTime == NULL );
    Vec_PtrFreeFree( p->vNamesIn );
    Vec_PtrFreeFree( p->vNamesOut );
    Vec_IntFreeP( &p->vSwitching );
    Vec_IntFreeP( &p->vSuper );
    Vec_IntFreeP( &p->vStore );
    Vec_IntFreeP( &p->vClassNew );
    Vec_IntFreeP( &p->vClassOld );
    Vec_WrdFreeP( &p->vSims );
    Vec_WrdFreeP( &p->vSimsT );
    Vec_WrdFreeP( &p->vSimsPi );
    Vec_WrdFreeP( &p->vSimsPo );
    Vec_IntFreeP( &p->vTimeStamps );
    Vec_FltFreeP( &p->vTiming );
    Vec_VecFreeP( &p->vClockDoms );
    Vec_IntFreeP( &p->vCofVars );
    Vec_IntFreeP( &p->vIdsOrig );
    Vec_IntFreeP( &p->vIdsEquiv );
    Vec_IntFreeP( &p->vLutConfigs );
    Vec_IntFreeP( &p->vEdgeDelay );
    Vec_IntFreeP( &p->vEdgeDelayR );
    Vec_IntFreeP( &p->vEdge1 );
    Vec_IntFreeP( &p->vEdge2 );
    Vec_IntFreeP( &p->vUserPiIds );
    Vec_IntFreeP( &p->vUserPoIds );
    Vec_IntFreeP( &p->vUserFfIds );
    Vec_IntFreeP( &p->vFlopClasses );
    Vec_IntFreeP( &p->vGateClasses );
    Vec_IntFreeP( &p->vObjClasses );
    Vec_IntFreeP( &p->vInitClasses );
    Vec_IntFreeP( &p->vRegClasses );
    Vec_IntFreeP( &p->vRegInits );
    Vec_IntFreeP( &p->vDoms );
    Vec_IntFreeP( &p->vBarBufs );
    Vec_IntFreeP( &p->vXors );
    Vec_IntFreeP( &p->vLevels );
    Vec_IntFreeP( &p->vTruths );
    Vec_IntErase( &p->vCopies );
    Vec_IntErase( &p->vCopies2 );
    Vec_IntFreeP( &p->vVar2Obj );
    Vec_IntErase( &p->vCopiesTwo );
    Vec_IntErase( &p->vSuppVars );
    Vec_WrdFreeP( &p->vSuppWords );
    Vec_IntFreeP( &p->vTtNums );
    Vec_IntFreeP( &p->vTtNodes );
    Vec_WrdFreeP( &p->vTtMemory );
    Vec_PtrFreeP( &p->vTtInputs );
    Vec_IntFreeP( &p->vMapping );
    Vec_WecFreeP( &p->vMapping2 );
    Vec_WecFreeP( &p->vFanouts2 );
    Vec_IntFreeP( &p->vCellMapping );
    Vec_IntFreeP( &p->vPacking );
    Vec_IntFreeP( &p->vConfigs );
    ABC_FREE( p->pCellStr );
    Vec_FltFreeP( &p->vInArrs );
    Vec_FltFreeP( &p->vOutReqs );
    Vec_IntFreeP( &p->vCiArrs );
    Vec_IntFreeP( &p->vCoReqs );
    Vec_IntFreeP( &p->vCoArrs );
    Vec_IntFreeP( &p->vCoAttrs );
    Gia_ManStopP( &p->pAigExtra );
    Vec_IntFree( p->vCis );
    Vec_IntFree( p->vCos );
    Vec_IntErase( &p->vHash );
    Vec_IntErase( &p->vHTable );
    Vec_IntErase( &p->vRefs );
    ABC_FREE( p->pData2 );
    ABC_FREE( p->pTravIds );
    ABC_FREE( p->pPlacement );
    ABC_FREE( p->pSwitching );
    ABC_FREE( p->pCexSeq );
    ABC_FREE( p->pCexComb );
    ABC_FREE( p->pIso );
//    ABC_FREE( p->pMapping );
    ABC_FREE( p->pFanData );
    ABC_FREE( p->pReprsOld );
    ABC_FREE( p->pReprs );
    ABC_FREE( p->pNexts );
    ABC_FREE( p->pSibls );
    ABC_FREE( p->pRefs );
    ABC_FREE( p->pLutRefs );
    ABC_FREE( p->pMuxes );
    ABC_FREE( p->pObjs );
    ABC_FREE( p->pSpec );
    ABC_FREE( p->pName );
    ABC_FREE( p );
}